

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseInstrList(WastParser *this,ExprList *exprs)

{
  Expr *pEVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  TokenType TVar4;
  TokenType TVar5;
  Result RVar6;
  Enum EVar7;
  ExprList *pEVar8;
  iterator pos;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  ExprList local_48;
  
  local_48.first_ = (Expr *)0x0;
  local_48.last_ = (Expr *)0x0;
  local_48.size_ = 0;
  do {
    TVar4 = Peek(this,0);
    TVar5 = Peek(this,1);
    if ((0x3d < TVar4 - AtomicLoad) ||
       ((0x3fff7effff9fbfffU >> ((ulong)(TVar4 - AtomicLoad) & 0x3f) & 1) == 0)) {
      pEVar3 = local_48.first_;
      if ((TVar4 != Lpar) || (0x3d < TVar5 - AtomicLoad)) {
        EVar7 = Ok;
        goto joined_r0x0016546c;
      }
      EVar7 = Ok;
      if ((0x3fff7effff9fbfffU >> ((ulong)(TVar5 - AtomicLoad) & 0x3f) & 1) == 0)
      goto joined_r0x0016546c;
    }
    RVar6 = ParseInstr(this,&local_48);
    pEVar3 = local_48.first_;
    if (RVar6.enum_ == Ok) {
      while (pEVar3 != (Expr *)0x0) {
        if (local_48.size_ == 0) {
          __assert_fail("!empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/intrusive-list.h"
                        ,0x223,
                        "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                       );
        }
        pEVar2 = (pEVar3->super_intrusive_list_base<wabt::Expr>).next_;
        if (local_48.first_ == local_48.last_) {
          local_48.first_ = (Expr *)0x0;
          local_48.last_ = (Expr *)0x0;
          pEVar1 = local_48.last_;
        }
        else {
          pEVar1 = (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_;
          pEVar8 = (ExprList *)&pEVar1->super_intrusive_list_base<wabt::Expr>;
          if (pEVar1 == (Expr *)0x0) {
            pEVar8 = &local_48;
          }
          pEVar8->first_ = pEVar2;
          if (pEVar2 != (Expr *)0x0) {
            (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar1;
            pEVar1 = local_48.last_;
          }
        }
        local_48.last_ = pEVar1;
        local_48.size_ = local_48.size_ - 1;
        (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
        (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
        pos.node_ = (Expr *)0x0;
        pos.list_ = exprs;
        local_50._M_head_impl = pEVar3;
        intrusive_list<wabt::Expr>::insert
                  (exprs,pos,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50);
        if (local_50._M_head_impl != (Expr *)0x0) {
          (*(local_50._M_head_impl)->_vptr_Expr[1])();
        }
        local_50._M_head_impl = (Expr *)0x0;
        pEVar3 = pEVar2;
      }
    }
    else {
      RVar6 = Synchronize(this,anon_unknown_1::IsInstr);
      if (RVar6.enum_ == Error) {
        EVar7 = Error;
        pEVar3 = local_48.first_;
joined_r0x0016546c:
        while (pEVar3 != (Expr *)0x0) {
          pEVar2 = (pEVar3->super_intrusive_list_base<wabt::Expr>).next_;
          (*pEVar3->_vptr_Expr[1])();
          pEVar3 = pEVar2;
        }
        return (Result)EVar7;
      }
    }
  } while( true );
}

Assistant:

Result WastParser::ParseInstrList(ExprList* exprs) {
  WABT_TRACE(ParseInstrList);
  ExprList new_exprs;
  while (IsInstr(PeekPair())) {
    if (Succeeded(ParseInstr(&new_exprs))) {
      exprs->splice(exprs->end(), new_exprs);
    } else {
      CHECK_RESULT(Synchronize(IsInstr));
    }
  }
  return Result::Ok;
}